

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.h
# Opt level: O3

void __thiscall
lunasvg::SVGElement::
transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
          (SVGElement *this,anon_class_16_2_c48942ba callback)

{
  pointer pvVar1;
  SVGElement *this_00;
  bool bVar2;
  int iVar3;
  pointer pvVar4;
  _List_node_base *p_Var5;
  SelectorList *__range2;
  Element local_30;
  
  pvVar4 = ((callback.selectors)->
           super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = ((callback.selectors)->
           super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pvVar4 == pvVar1) {
LAB_0011a91e:
      for (p_Var5 = (this->m_children).
                    super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var5 != (_List_node_base *)&this->m_children; p_Var5 = p_Var5->_M_next) {
        this_00 = (SVGElement *)p_Var5[1]._M_next;
        if (this_00 != (SVGElement *)0x0) {
          iVar3 = (*(this_00->super_SVGNode)._vptr_SVGNode[3])(this_00);
          if ((char)iVar3 != '\0') {
            transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
                      (this_00,callback);
          }
        }
      }
      return;
    }
    bVar2 = matchSelector((lunasvg *)
                          (pvVar4->
                          super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (Selector *)
                          (pvVar4->
                          super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                          )._M_impl.super__Vector_impl_data._M_finish,this);
    if (bVar2) {
      Element::Element(&local_30,this);
      std::vector<lunasvg::Element,_std::allocator<lunasvg::Element>_>::
      emplace_back<lunasvg::Element>(callback.elements,&local_30);
      goto LAB_0011a91e;
    }
    pvVar4 = pvVar4 + 1;
  } while( true );
}

Assistant:

inline void SVGElement::transverse(T callback)
{
    callback(this);
    for(const auto& child : m_children) {
        if(auto element = toSVGElement(child)) {
            element->transverse(callback);
        }
    }
}